

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler.cpp
# Opt level: O2

void __thiscall CScheduler::MockForward(CScheduler *this,seconds delta_seconds)

{
  _Rb_tree_header *__pos;
  long lVar1;
  _Base_ptr p_Var2;
  long in_FS_OFFSET;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_80;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock4;
  multimap<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::function<void_()>,_std::less<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<const_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::function<void_()>_>_>_>
  temp_queue;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (0xe0f < delta_seconds.__r - 1U) {
    __assert_fail("delta_seconds > 0s && delta_seconds <= 1h",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/scheduler.cpp"
                  ,0x52,"void CScheduler::MockForward(std::chrono::seconds)");
  }
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (&criticalblock4,&this->newTaskMutex,"newTaskMutex",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/scheduler.cpp"
             ,0x55,false);
  __pos = &temp_queue._M_t._M_impl.super__Rb_tree_header;
  temp_queue._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  temp_queue._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  temp_queue._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = (this->taskQueue)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  temp_queue._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &__pos->_M_header;
  temp_queue._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &__pos->_M_header;
  for (; (_Rb_tree_header *)p_Var2 != &(this->taskQueue)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var2)) {
    local_80.__d.__r = (duration)(*(long *)(p_Var2 + 1) + delta_seconds.__r * -1000000000);
    std::
    _Rb_tree<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,std::function<void()>>,std::_Select1st<std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,std::function<void()>>>,std::less<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>,std::allocator<std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,std::function<void()>>>>
    ::
    _M_emplace_hint_equal<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::function<void()>const&>
              ((_Rb_tree<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,std::function<void()>>,std::_Select1st<std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,std::function<void()>>>,std::less<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>,std::allocator<std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,std::function<void()>>>>
                *)&temp_queue,(const_iterator)__pos,&local_80,
               (function<void_()> *)&p_Var2[1]._M_parent);
  }
  std::
  _Rb_tree<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::pair<const_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::function<void_()>_>,_std::_Select1st<std::pair<const_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::function<void_()>_>_>,_std::less<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<const_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::function<void_()>_>_>_>
  ::operator=(&(this->taskQueue)._M_t,&temp_queue._M_t);
  std::
  _Rb_tree<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::pair<const_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::function<void_()>_>,_std::_Select1st<std::pair<const_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::function<void_()>_>_>,_std::less<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<const_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::function<void_()>_>_>_>
  ::~_Rb_tree(&temp_queue._M_t);
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock4.super_unique_lock);
  std::condition_variable::notify_one();
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CScheduler::MockForward(std::chrono::seconds delta_seconds)
{
    assert(delta_seconds > 0s && delta_seconds <= 1h);

    {
        LOCK(newTaskMutex);

        // use temp_queue to maintain updated schedule
        std::multimap<std::chrono::steady_clock::time_point, Function> temp_queue;

        for (const auto& element : taskQueue) {
            temp_queue.emplace_hint(temp_queue.cend(), element.first - delta_seconds, element.second);
        }

        // point taskQueue to temp_queue
        taskQueue = std::move(temp_queue);
    }

    // notify that the taskQueue needs to be processed
    newTaskScheduled.notify_one();
}